

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

ErrorKind * __thiscall
Fixpp::result::Result<void,_Fixpp::ErrorKind>::unwrapErr
          (ErrorKind *__return_storage_ptr__,Result<void,_Fixpp::ErrorKind> *this)

{
  bool bVar1;
  storage_type *this_00;
  ErrorKind *pEVar2;
  Result<void,_Fixpp::ErrorKind> *this_local;
  
  bVar1 = isErr(this);
  if (!bVar1) {
    fprintf(_stderr,"Attempting to unwrapErr an ok Result\n");
    std::terminate();
  }
  this_00 = storage(this);
  pEVar2 = details::Storage<void,_Fixpp::ErrorKind>::get<Fixpp::ErrorKind>(this_00);
  ErrorKind::ErrorKind(__return_storage_ptr__,pEVar2);
  return __return_storage_ptr__;
}

Assistant:

E unwrapErr() const {
        if (isErr()) {
            return storage().template get<E>();
        }

        std::fprintf(stderr, "Attempting to unwrapErr an ok Result\n");
        std::terminate();
    }